

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O0

bool __thiscall
IR::Instr::IterateArgInstrs<Inline::Optimize(Func*,IR::Instr**,unsigned_short,unsigned_int)::__1>
          (Instr *this,anon_class_8_1_406103b2 callback)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  StackSym *pSVar4;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  Instr *instr;
  byte local_41;
  Instr *local_38;
  Instr *nextArg;
  Instr *argInstr;
  StackSym *linkSym;
  Instr *this_local;
  anon_class_8_1_406103b2 callback_local;
  
  this_local = (Instr *)callback.constantArguments;
  pOVar3 = GetSrc2(this);
  pSVar4 = Opnd::GetStackSym(pOVar3);
  bVar2 = StackSym::IsSingleDef(pSVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  nextArg = (pSVar4->field_5).m_instrDef;
  do {
    pOVar3 = GetSrc2(nextArg);
    if (pOVar3 == (Opnd *)0x0) {
LAB_00710f8b:
      local_38 = (Instr *)0x0;
    }
    else {
      pOVar3 = GetSrc2(nextArg);
      bVar2 = Opnd::IsSymOpnd(pOVar3);
      if (!bVar2) goto LAB_00710f8b;
      pOVar3 = GetSrc2(nextArg);
      pSVar6 = Opnd::AsSymOpnd(pOVar3);
      pSVar4 = Sym::AsStackSym(pSVar6->m_sym);
      bVar2 = StackSym::IsArgSlotSym(pSVar4);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = StackSym::IsSingleDef(pSVar4);
      if (((!bVar2) && (bVar2 = Func::IsInPhase(this->m_func,FGPeepsPhase), !bVar2)) &&
         (bVar2 = Func::IsInPhase(this->m_func,FGBuildPhase), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_38 = StackSym::GetInstrDef(pSVar4);
    }
    if (nextArg->m_opcode != ArgOut_A_InlineSpecialized) {
      if (nextArg->m_opcode == StartCall) {
        if (local_38 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        break;
      }
      bVar2 = Inline::Optimize::anon_class_8_1_406103b2::operator()
                        ((anon_class_8_1_406103b2 *)&this_local,nextArg);
      if (bVar2) {
        return true;
      }
    }
    nextArg = local_38;
    local_41 = 0;
    if (local_38 != (Instr *)0x0) {
      bVar2 = IsInvalidInstr(local_38);
      local_41 = bVar2 ^ 0xff;
    }
  } while ((local_41 & 1) != 0);
  if ((nextArg != (Instr *)0x0) && (bVar2 = IsInvalidInstr(nextArg), bVar2)) {
    instr = New(InvalidOpCode,this->m_func);
    InsertBefore(this,instr);
  }
  return false;
}

Assistant:

bool IterateArgInstrs(Fn callback)
    {
        StackSym* linkSym = this->GetSrc2()->GetStackSym();
        Assert(linkSym->IsSingleDef());
        IR::Instr *argInstr = linkSym->m_instrDef;
        IR::Instr* nextArg = nullptr;
        do
        {
            // Get the next instr before calling 'callback' since callback might modify the IR.
            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
            {
                linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
                Assert(linkSym->IsArgSlotSym());

                // Due to dead code elimination in FGPeeps, it is possible for the definitions of the
                // the instructions that we are visiting during FG to have been freed. In this case,
                // the ArgSlot, even though its was a single def, will report IsSingleDef() as false
                // since instrDef is reset to nullptr when the def instr is freed
                Assert(linkSym->IsSingleDef() ||
                    (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)));
                nextArg = linkSym->GetInstrDef();
            }
            else
            {
                nextArg = nullptr;
            }
            if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
            {
                argInstr = nextArg;
                // This is a fake ArgOut, skip it
                continue;
            }
            if (argInstr->m_opcode == Js::OpCode::StartCall)
            {
                Assert(nextArg == nullptr);
                break;
            }

            if(callback(argInstr))
            {
                return true;
            }
            argInstr = nextArg;
        } while(argInstr && !argInstr->IsInvalidInstr());

        // If an instr in the call sequence is invalid (0xFDFDFDFD), it must have been freed.
        // This is possible if some dead-code-removal/peeps code removed only part of the call sequence, while the whole sequence was dead (TH Bug 594245).
        // We allow this possibility here, while relying on the more involved dead-code-removal to remove the rest of the call sequence.
        // Inserting the opcode InvalidOpCode, with no lowering, here to safeguard against the possibility of a dead part of the call sequence not being removed. The lowerer would assert then.
        if (argInstr && argInstr->IsInvalidInstr())
        {
            this->InsertBefore(Instr::New(Js::OpCode::InvalidOpCode, this->m_func));
        }
        return false;
    }